

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

int addk(FuncState *fs,TValue *key,TValue *v)

{
  Value *pVVar1;
  Proto *o;
  lua_State *L;
  Value VVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  TValue *pTVar7;
  long lVar8;
  long lVar9;
  int *piVar10;
  TValue *io;
  ulong uVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  
  o = fs->f;
  L = fs->ls->L;
  pTVar7 = luaH_set(L,fs->ls->h,key);
  if ((pTVar7->tt_ == 0x13) && (iVar13 = (pTVar7->value_).b, iVar13 < fs->nk)) {
    if ((((v->tt_ ^ o->k[iVar13].tt_) & 0x3fU) == 0) &&
       (iVar6 = luaV_equalobj((lua_State *)0x0,o->k + iVar13,v), iVar6 != 0)) {
      return iVar13;
    }
  }
  iVar13 = o->sizek;
  iVar6 = fs->nk;
  (pTVar7->value_).i = (long)iVar6;
  pTVar7->tt_ = 0x13;
  iVar16 = o->sizek;
  if (iVar16 <= iVar6) {
    pTVar7 = (TValue *)luaM_growaux_(L,o->k,&o->sizek,0x10,0x3ffffff,"constants");
    o->k = pTVar7;
    iVar16 = o->sizek;
  }
  auVar5 = _DAT_00160820;
  auVar4 = _DAT_00160810;
  auVar3 = _DAT_00160800;
  pTVar7 = o->k;
  if (iVar13 < iVar16) {
    lVar8 = (long)iVar16 - (long)iVar13;
    lVar9 = lVar8 + -1;
    auVar12._8_4_ = (int)lVar9;
    auVar12._0_8_ = lVar9;
    auVar12._12_4_ = (int)((ulong)lVar9 >> 0x20);
    piVar10 = &pTVar7[(long)iVar13 + 3].tt_;
    uVar11 = 0;
    auVar12 = auVar12 ^ _DAT_00160820;
    do {
      auVar14._8_4_ = (int)uVar11;
      auVar14._0_8_ = uVar11;
      auVar14._12_4_ = (int)(uVar11 >> 0x20);
      auVar15 = (auVar14 | auVar4) ^ auVar5;
      iVar13 = auVar12._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar13 && auVar12._0_4_ < auVar15._0_4_ ||
                  iVar13 < auVar15._4_4_) & 1)) {
        piVar10[-0xc] = 0;
      }
      if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
          auVar15._12_4_ <= auVar12._12_4_) {
        piVar10[-8] = 0;
      }
      auVar14 = (auVar14 | auVar3) ^ auVar5;
      iVar16 = auVar14._4_4_;
      if (iVar16 <= iVar13 && (iVar16 != iVar13 || auVar14._0_4_ <= auVar12._0_4_)) {
        piVar10[-4] = 0;
        *piVar10 = 0;
      }
      uVar11 = uVar11 + 4;
      piVar10 = piVar10 + 0x10;
    } while ((lVar8 + 3U & 0xfffffffffffffffc) != uVar11);
  }
  VVar2 = *(Value *)&v->tt_;
  pVVar1 = &pTVar7[iVar6].value_;
  *pVVar1 = v->value_;
  pVVar1[1] = VVar2;
  fs->nk = fs->nk + 1;
  if ((((v->tt_ & 0x40) != 0) && ((o->marked & 4) != 0)) && ((((v->value_).gc)->marked & 3) != 0)) {
    luaC_barrier_(L,(GCObject *)o,(v->value_).gc);
  }
  return iVar6;
}

Assistant:

static int addk (FuncState *fs, TValue *key, TValue *v) {
  lua_State *L = fs->ls->L;
  Proto *f = fs->f;
  TValue *idx = luaH_set(L, fs->ls->h, key);  /* index scanner table */
  int k, oldsize;
  if (ttisinteger(idx)) {  /* is there an index there? */
    k = cast_int(ivalue(idx));
    /* correct value? (warning: must distinguish floats from integers!) */
    if (k < fs->nk && ttypetag(&f->k[k]) == ttypetag(v) &&
                      luaV_rawequalobj(&f->k[k], v))
      return k;  /* reuse index */
  }
  /* constant not found; create a new entry */
  oldsize = f->sizek;
  k = fs->nk;
  /* numerical value does not need GC barrier;
     table has no metatable, so it does not need to invalidate cache */
  setivalue(idx, k);
  luaM_growvector(L, f->k, k, f->sizek, TValue, MAXARG_Ax, "constants");
  while (oldsize < f->sizek) setnilvalue(&f->k[oldsize++]);
  setobj(L, &f->k[k], v);
  fs->nk++;
  luaC_barrier(L, f, v);
  return k;
}